

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O0

void __thiscall
level_mesh::merge_orphans
          (level_mesh *this,b_submesh_vec *orphans,size_t num_groups,bool consider_gamemtl)

{
  float fVar1;
  undefined8 uVar2;
  b_submesh *pbVar3;
  bool bVar4;
  size_type sVar5;
  reference ppbVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  pointer pbVar10;
  reference pbVar11;
  _vector3<float> *this_00;
  reference ppbVar12;
  vector<b_submesh_*,_std::allocator<b_submesh_*>_> local_b8;
  _vector3<float> local_9c;
  float local_90;
  float local_8c;
  float dist;
  uint32_t tag;
  b_face_vec_it end1;
  b_face_vec_it it1;
  float local_70;
  float min_dist2;
  float min_dist1;
  uint32_t tag2;
  uint32_t tag1;
  fvector3 p;
  b_face *face;
  b_submesh *local_48;
  b_submesh *sm;
  b_submesh_vec_it end;
  b_submesh_vec_it it;
  uint32_t max_tag;
  uint32_t min_tag;
  bool consider_gamemtl_local;
  size_t num_groups_local;
  b_submesh_vec *orphans_local;
  level_mesh *this_local;
  
  bVar4 = std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::empty(orphans);
  if (!bVar4) {
    sVar5 = std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::size(orphans);
    xray_re::msg("merging %Iu orphan(s)",sVar5);
    fVar1 = (float)this->m_free_tag;
    end._M_current =
         (b_submesh **)std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::begin(orphans);
    sm = (b_submesh *)std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::end(orphans);
    while (bVar4 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<b_submesh_**,_std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>_>
                                    *)&sm), bVar4) {
      face = (b_face *)
             __gnu_cxx::
             __normal_iterator<b_submesh_**,_std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>_>
             ::operator++(&end,0);
      ppbVar6 = __gnu_cxx::
                __normal_iterator<b_submesh_**,_std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>_>
                ::operator*((__normal_iterator<b_submesh_**,_std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>_>
                             *)&face);
      local_48 = *ppbVar6;
      p.field_0._4_8_ =
           std::
           vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ::operator[](&(this->super_xr_mesh_builder).m_faces,
                        (ulong)(local_48->super_b_model_instance).min_face);
      pvVar7 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
               operator[](&(this->super_xr_mesh_builder).super_xr_mesh.m_points,
                          (ulong)(((reference)p.field_0._4_8_)->field_0).field_0.v[0]);
      pvVar8 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
               operator[](&(this->super_xr_mesh_builder).super_xr_mesh.m_points,
                          (ulong)*(uint *)(p.field_0._4_8_ + 4));
      pvVar9 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
               operator[](&(this->super_xr_mesh_builder).super_xr_mesh.m_points,
                          (ulong)*(uint *)(p.field_0._4_8_ + 8));
      xray_re::_vector3<float>::calc_center((_vector3<float> *)&tag2,pvVar7,pvVar8,pvVar9);
      min_dist1 = -NAN;
      min_dist2 = -NAN;
      it1._M_current._4_4_ = std::numeric_limits<float>::max();
      end1._M_current =
           (b_face *)
           std::
           vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ::begin(&(this->super_xr_mesh_builder).m_faces);
      _dist = std::
              vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
              ::end(&(this->super_xr_mesh_builder).m_faces);
      local_70 = it1._M_current._4_4_;
      while (bVar4 = __gnu_cxx::operator!=
                               (&end1,(__normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                                       *)&dist), bVar4) {
        pbVar10 = __gnu_cxx::
                  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                  ::operator->(&end1);
        uVar2 = p.field_0._4_8_;
        local_8c = (float)pbVar10->tag;
        if ((((uint)fVar1 <= (uint)local_8c) &&
            ((uint)local_8c <= ((int)fVar1 + (int)num_groups) - 1U)) &&
           (pbVar11 = __gnu_cxx::
                      __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                      ::operator*(&end1), (reference)uVar2 != pbVar11)) {
          memset(&local_9c,0,0xc);
          pbVar10 = __gnu_cxx::
                    __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                    ::operator->(&end1);
          pvVar7 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   ::operator[](&(this->super_xr_mesh_builder).super_xr_mesh.m_points,
                                (ulong)(pbVar10->field_0).field_0.v[0]);
          pbVar10 = __gnu_cxx::
                    __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                    ::operator->(&end1);
          pvVar8 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   ::operator[](&(this->super_xr_mesh_builder).super_xr_mesh.m_points,
                                (ulong)(pbVar10->field_0).field_0.v[1]);
          pbVar10 = __gnu_cxx::
                    __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                    ::operator->(&end1);
          pvVar9 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   ::operator[](&(this->super_xr_mesh_builder).super_xr_mesh.m_points,
                                (ulong)(pbVar10->field_0).field_0.v[2]);
          this_00 = xray_re::_vector3<float>::calc_center(&local_9c,pvVar7,pvVar8,pvVar9);
          local_90 = xray_re::_vector3<float>::distance(this_00,(_vector3<float> *)&tag2);
          if (local_90 < local_70) {
            min_dist1 = local_8c;
            local_70 = local_90;
          }
          if (((consider_gamemtl) && (local_90 < it1._M_current._4_4_)) &&
             (pbVar10 = __gnu_cxx::
                        __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                        ::operator->(&end1),
             *(short *)((long)&pbVar10->field_1 + 4) == *(short *)(p.field_0._4_8_ + 0x34))) {
            it1._M_current._4_4_ = local_90;
            min_dist2 = local_8c;
          }
        }
        __gnu_cxx::
        __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
        ::operator++(&end1);
      }
      if ((consider_gamemtl) && (min_dist2 != -NAN)) {
        min_dist1 = min_dist2;
        local_70 = it1._M_current._4_4_;
      }
      xray_re::msg("nearest: %u (%.2f)",(double)local_70,(ulong)(uint)min_dist1);
      ppbVar12 = std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>::at
                           (&this->m_instances,(ulong)(uint)min_dist1);
      merge(this,*ppbVar12,&local_48->super_b_model_instance);
      pbVar3 = local_48;
      if (local_48 != (b_submesh *)0x0) {
        b_submesh::~b_submesh(local_48);
        operator_delete(pbVar3,0xe0);
      }
    }
    memset(&local_b8,0,0x18);
    std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::vector(&local_b8);
    std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::swap(&local_b8,orphans);
    std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::~vector(&local_b8);
  }
  return;
}

Assistant:

void level_mesh::merge_orphans(b_submesh_vec& orphans, size_t num_groups, bool consider_gamemtl)
{
	if (orphans.empty())
		return;
	msg("merging %" PRIuSIZET " orphan(s)", orphans.size());
	uint32_t min_tag = m_free_tag, max_tag = min_tag + uint32_t(num_groups & UINT32_MAX) - 1;
	for (b_submesh_vec_it it = orphans.begin(), end = orphans.end(); it != end;) {
		b_submesh* sm = *it++;
		const b_face* face = &m_faces[sm->min_face];
		fvector3 p;
		p.calc_center(m_points[face->v0], m_points[face->v1], m_points[face->v2]);
		uint32_t tag1 = BAD_IDX, tag2 = tag1;
		float min_dist1 = xr_numeric_limits<float>::max(), min_dist2 = min_dist1;
		for (b_face_vec_it it1 = m_faces.begin(), end1 = m_faces.end(); it1 != end1; ++it1) {
			uint32_t tag;
			if ((tag = it1->tag) >= min_tag && tag <= max_tag && face != &*it1) {
				float dist = fvector3().calc_center(m_points[it1->v0], m_points[it1->v1], m_points[it1->v2]).distance(p);
				if (min_dist1 > dist) {
					min_dist1 = dist;
					tag1 = tag;
				}
				if (consider_gamemtl && min_dist2 > dist &&
						it1->surface.gamemtl == face->surface.gamemtl) {
					min_dist2 = dist;
					tag2 = tag;
				}
			}
		}
		if (consider_gamemtl && tag2 != BAD_IDX) {
			tag1 = tag2;
			min_dist1 = min_dist2;
		}
		msg("nearest: %" PRIu32 " (%.2f)", tag1, min_dist1);
		merge(m_instances.at(tag1), sm);
		delete sm;
	}
	b_submesh_vec().swap(orphans);
}